

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

int uv_read_stop(uv_stream_t *stream)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  
  if ((stream->flags & 4) != 0) {
    stream->flags = stream->flags & 0xfffffffb;
    uv__io_stop(stream->loop,&stream->io_watcher,1);
    iVar3 = uv__io_active(&stream->io_watcher,4);
    if (((iVar3 == 0) && (uVar2 = stream->flags, (uVar2 >> 0xe & 1) != 0)) &&
       (stream->flags = uVar2 & 0xffffbfff, (uVar2 >> 0xd & 1) != 0)) {
      puVar1 = &stream->loop->active_handles;
      *puVar1 = *puVar1 - 1;
    }
    stream->alloc_cb = (uv_alloc_cb)0x0;
    stream->read_cb = (uv_read_cb)0x0;
  }
  return 0;
}

Assistant:

int uv_read_stop(uv_stream_t* stream) {
  if (!(stream->flags & UV_STREAM_READING))
    return 0;

  stream->flags &= ~UV_STREAM_READING;
  uv__io_stop(stream->loop, &stream->io_watcher, POLLIN);
  if (!uv__io_active(&stream->io_watcher, POLLOUT))
    uv__handle_stop(stream);
  uv__stream_osx_interrupt_select(stream);

  stream->read_cb = NULL;
  stream->alloc_cb = NULL;
  return 0;
}